

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::BitfieldExtractCaseInstance::compare
          (BitfieldExtractCaseInstance *this,void **inputs,void **outputs)

{
  DataType dataType;
  uint uVar1;
  ostream *stream;
  byte bVar2;
  uint uVar3;
  ostringstream *this_00;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  Hex<8UL> local_38;
  
  dataType = (((this->super_IntegerFunctionTestInstance).m_spec.inputs.
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type;
  uVar1 = glu::getDataTypeScalarSize(dataType);
  if (0 < (int)uVar1) {
    bVar2 = (byte)*inputs[2];
    uVar3 = ~(-1 << (bVar2 & 0x1f));
    if (*inputs[2] == 0x20) {
      uVar3 = 0xffffffff;
    }
    uVar5 = 0;
    bVar7 = false;
    do {
      uVar4 = 0;
      if (*inputs[1] != 0x20) {
        uVar4 = *(uint *)((long)*inputs + uVar5 * 4) >> ((byte)*inputs[1] & 0x1f) & uVar3;
      }
      uVar6 = uVar4 & 1 << (bVar2 - 1 & 0x1f);
      if (uVar6 != 0) {
        uVar6 = ~uVar3;
      }
      if (3 < dataType - TYPE_INT) {
        uVar6 = 0;
      }
      if (*(uint *)((long)*outputs + uVar5 * 4) != (uVar6 | uVar4)) {
        this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        stream = (ostream *)std::ostream::operator<<(this_00,(int)uVar5);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"] = ",4);
        local_38.value = (deUint64)(uVar6 | uVar4);
        tcu::Format::Hex<8UL>::toStream(&local_38,stream);
        return bVar7;
      }
      uVar5 = uVar5 + 1;
      bVar7 = uVar1 <= uVar5;
    } while (uVar5 != uVar1);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				offset			= *((const int*)inputs[1]);
		const int				bits			= *((const int*)inputs[2]);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	out		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	valMask	= (bits == 32 ? ~0u : ((1u<<bits)-1u));
			const deUint32	baseVal	= (offset == 32) ? (0) : ((value >> offset) & valMask);
			const deUint32	ref		= baseVal | ((isSigned && (baseVal & (1<<(bits-1)))) ? ~valMask : 0u);

			if (out != ref)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref);
				return false;
			}
		}

		return true;
	}